

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

BlockStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::BlockStatementSyntax,slang::syntax::SyntaxKind_const&,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::NamedBlockClauseSyntax*,slang::syntax::SyntaxList<slang::syntax::SyntaxNode>&,slang::parsing::Token,slang::syntax::NamedBlockClauseSyntax*>
          (BumpAllocator *this,SyntaxKind *args,NamedLabelSyntax **args_1,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_2,Token *args_3,
          NamedBlockClauseSyntax **args_4,SyntaxList<slang::syntax::SyntaxNode> *args_5,
          Token *args_6,NamedBlockClauseSyntax **args_7)

{
  Token begin;
  Token end;
  BlockStatementSyntax *pBVar1;
  NamedBlockClauseSyntax *in_RDX;
  Info *unaff_RBX;
  SyntaxList<slang::syntax::SyntaxNode> *in_RSI;
  undefined8 in_RDI;
  Info *in_R8;
  undefined8 in_R9;
  NamedBlockClauseSyntax *unaff_retaddr;
  undefined8 *in_stack_00000010;
  size_t in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  BumpAllocator *in_stack_ffffffffffffff98;
  
  pBVar1 = (BlockStatementSyntax *)
           allocate(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  begin.info = in_R8;
  begin.kind = (short)in_R9;
  begin._2_1_ = (char)((ulong)in_R9 >> 0x10);
  begin.numFlags.raw = (char)((ulong)in_R9 >> 0x18);
  begin.rawLen = (int)((ulong)in_R9 >> 0x20);
  end.info = unaff_RBX;
  end.kind = (short)in_RDI;
  end._2_1_ = (char)((ulong)in_RDI >> 0x10);
  end.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
  end.rawLen = (int)((ulong)in_RDI >> 0x20);
  slang::syntax::BlockStatementSyntax::BlockStatementSyntax
            ((BlockStatementSyntax *)in_R8->location,(SyntaxKind)((ulong)in_R8->rawTextPtr >> 0x20),
             (NamedLabelSyntax *)in_stack_00000010[1],
             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)*in_stack_00000010,begin,in_RDX,
             in_RSI,end,unaff_retaddr);
  return pBVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }